

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  int __fd;
  void *pvVar4;
  undefined8 *puVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  undefined8 *in_RCX;
  uint64_t file_size;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  _func_int **local_38;
  
  *in_RCX = 0;
  __fd = open((char *)*result,0x80000);
  if (__fd < 0) {
    piVar6 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)result,*piVar6);
  }
  else {
    LOCK();
    piVar6 = (int *)((long)&filename[8].field_2 + 8);
    iVar1 = *piVar6;
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (iVar1 < 1) {
      LOCK();
      piVar6 = (int *)((long)&filename[8].field_2 + 8);
      *piVar6 = *piVar6 + 1;
      UNLOCK();
      puVar5 = (undefined8 *)operator_new(0x38);
      std::__cxx11::string::string((string *)&local_78,(string *)result);
      uVar3 = local_70;
      *puVar5 = &PTR__PosixRandomAccessFile_00116a08;
      LOCK();
      piVar6 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar1 = *piVar6;
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      piVar6 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar8 = __fd;
      if (iVar1 < 1) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
        iVar8 = -1;
      }
      *(bool *)(puVar5 + 1) = 0 < iVar1;
      *(int *)((long)puVar5 + 0xc) = iVar8;
      puVar5[2] = piVar6;
      puVar5[3] = puVar5 + 5;
      if (local_78 == &local_68) {
        puVar5[5] = CONCAT71(uStack_67,local_68);
        puVar5[6] = uStack_60;
      }
      else {
        puVar5[3] = local_78;
        puVar5[5] = CONCAT71(uStack_67,local_68);
      }
      local_70 = 0;
      puVar5[4] = uVar3;
      local_68 = 0;
      local_78 = &local_68;
      if (iVar1 < 1) {
        close(__fd);
      }
      *in_RCX = puVar5;
      std::__cxx11::string::_M_dispose();
      (this->super_Env)._vptr_Env = (_func_int **)0x0;
    }
    else {
      piVar6 = (int *)((long)&filename[8].field_2 + 8);
      (**(code **)((filename->_M_dataplus)._M_p + 0x58))(this,filename,result,&file_size);
      if ((this->super_Env)._vptr_Env == (_func_int **)0x0) {
        pvVar4 = mmap((void *)0x0,file_size,1,1,__fd,0);
        if (pvVar4 == (void *)0xffffffffffffffff) {
          piVar7 = __errno_location();
          PosixError((anon_unknown_1 *)&local_38,(string *)result,*piVar7);
          pp_Var2 = (this->super_Env)._vptr_Env;
          (this->super_Env)._vptr_Env = local_38;
          local_38 = pp_Var2;
          Status::~Status((Status *)&local_38);
        }
        else {
          puVar5 = (undefined8 *)operator_new(0x40);
          std::__cxx11::string::string((string *)&local_58,(string *)result);
          uVar3 = local_50;
          *puVar5 = &PTR__PosixMmapReadableFile_00116a30;
          puVar5[1] = pvVar4;
          puVar5[2] = file_size;
          puVar5[3] = piVar6;
          puVar5[4] = puVar5 + 6;
          if (local_58 == &local_48) {
            puVar5[6] = CONCAT71(uStack_47,local_48);
            puVar5[7] = uStack_40;
          }
          else {
            puVar5[4] = local_58;
            puVar5[6] = CONCAT71(uStack_47,local_48);
          }
          local_50 = 0;
          puVar5[5] = uVar3;
          local_48 = 0;
          *in_RCX = puVar5;
          local_58 = &local_48;
          std::__cxx11::string::_M_dispose();
        }
      }
      close(__fd);
      if ((this->super_Env)._vptr_Env != (_func_int **)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }